

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.h
# Opt level: O3

cgltf_result cgltf_validate(cgltf_data *data)

{
  cgltf_component_type cVar1;
  cgltf_meshopt_compression_mode cVar2;
  cgltf_buffer_view *pcVar3;
  cgltf_buffer_view *pcVar4;
  cgltf_mesh *pcVar5;
  cgltf_primitive *pcVar6;
  cgltf_accessor *pcVar7;
  cgltf_accessor *pcVar8;
  cgltf_animation_sampler *pcVar9;
  cgltf_size cVar10;
  cgltf_size cVar11;
  cgltf_size *pcVar12;
  cgltf_size i;
  cgltf_meshopt_compression_filter *pcVar13;
  cgltf_accessor **ppcVar14;
  cgltf_node *pcVar15;
  long lVar16;
  cgltf_size cVar17;
  cgltf_node *pcVar18;
  cgltf_size cVar19;
  cgltf_animation_path_type *pcVar20;
  cgltf_size cVar21;
  cgltf_size cVar22;
  bool bVar23;
  
  cVar21 = data->accessors_count;
  if (cVar21 != 0) {
    pcVar12 = &(data->accessors->sparse).values_byte_offset;
    do {
      cVar10 = cgltf_calc_size(*(cgltf_type *)(pcVar12 + -0x1c),
                               *(cgltf_component_type *)(pcVar12 + -0x1d));
      if ((pcVar12[-0x18] != 0) &&
         (*(ulong *)(pcVar12[-0x18] + 0x10) <
          pcVar12[-0x1b] + cVar10 + (pcVar12[-0x1a] + -1) * pcVar12[-0x19])) {
        return cgltf_result_data_too_short;
      }
      if ((int)pcVar12[-6] != 0) {
        cVar1 = *(cgltf_component_type *)(pcVar12 + -2);
        if (cVar1 - cgltf_component_type_r_8 < 6) {
          lVar16 = *(long *)(&DAT_0011c218 + (ulong)(cVar1 - cgltf_component_type_r_8) * 8);
        }
        else {
          lVar16 = 0;
        }
        pcVar3 = (cgltf_buffer_view *)pcVar12[-4];
        if (pcVar3->size < lVar16 * ((cgltf_accessor_sparse *)(pcVar12 + -5))->count + pcVar12[-3])
        {
          return cgltf_result_data_too_short;
        }
        if (((cgltf_buffer_view *)pcVar12[-1])->size <
            cVar10 * ((cgltf_accessor_sparse *)(pcVar12 + -5))->count + *pcVar12) {
          return cgltf_result_data_too_short;
        }
        if (cgltf_component_type_r_32u < cVar1) {
          return cgltf_result_invalid_gltf;
        }
        if ((0x34U >> (cVar1 & 0x1f) & 1) == 0) {
          return cgltf_result_invalid_gltf;
        }
        pcVar4 = (cgltf_buffer_view *)pcVar3->buffer->data;
        if ((pcVar4 != (cgltf_buffer_view *)0x0) &&
           (cVar10 = cgltf_calc_index_bound
                               (pcVar4,pcVar3->offset,(cgltf_component_type)pcVar12[-3],(ulong)cVar1
                               ), pcVar12[-0x1a] <= cVar10)) {
          return cgltf_result_data_too_short;
        }
      }
      pcVar12 = pcVar12 + 0x2e;
      cVar21 = cVar21 - 1;
    } while (cVar21 != 0);
  }
  cVar21 = data->buffer_views_count;
  if (cVar21 != 0) {
    pcVar13 = &(data->buffer_views->meshopt_compression).filter;
    do {
      if ((*(ulong **)(pcVar13 + -0x19) != (ulong *)0x0) &&
         (**(ulong **)(pcVar13 + -0x19) <
          (ulong)(*(long *)(pcVar13 + -0x15) + *(long *)(pcVar13 + -0x17)))) {
        return cgltf_result_data_too_short;
      }
      if (pcVar13[-0xd] != 0) {
        if (((cgltf_meshopt_compression *)(pcVar13 + -0xb))->buffer == (cgltf_buffer *)0x0) {
          return cgltf_result_data_too_short;
        }
        if (((cgltf_meshopt_compression *)(pcVar13 + -0xb))->buffer->size <
            *(cgltf_size *)(pcVar13 + -7) + *(cgltf_size *)(pcVar13 + -9)) {
          return cgltf_result_data_too_short;
        }
        cVar10 = *(cgltf_size *)(pcVar13 + -0x13);
        cVar19 = *(cgltf_size *)(pcVar13 + -5);
        if ((cVar10 != 0) && (bVar23 = cVar19 != cVar10, cVar19 = cVar10, bVar23)) {
          return cgltf_result_invalid_gltf;
        }
        if (*(long *)(pcVar13 + -0x15) != *(cgltf_size *)(pcVar13 + -3) * cVar19) {
          return cgltf_result_invalid_gltf;
        }
        cVar2 = pcVar13[-1];
        if (cVar2 == cgltf_meshopt_compression_mode_attributes) {
          if (0x100 < cVar19) {
            return cgltf_result_invalid_gltf;
          }
          if ((cVar19 & 3) != 0) {
            return cgltf_result_invalid_gltf;
          }
        }
        else {
          if (cVar2 == cgltf_meshopt_compression_mode_triangles) {
            if (0x5555555555555555 < *(cgltf_size *)(pcVar13 + -3) * -0x5555555555555555) {
              return cgltf_result_invalid_gltf;
            }
          }
          else {
            if (cVar2 == cgltf_meshopt_compression_mode_invalid) {
              return cgltf_result_invalid_gltf;
            }
            if ((cVar2 & ~cgltf_meshopt_compression_mode_attributes) !=
                cgltf_meshopt_compression_mode_triangles) goto LAB_00104e67;
          }
          if ((cVar19 != 4) && (cVar19 != 2)) {
            return cgltf_result_invalid_gltf;
          }
          if (*pcVar13 != cgltf_meshopt_compression_filter_none) {
            return cgltf_result_invalid_gltf;
          }
        }
LAB_00104e67:
        if (((*pcVar13 == cgltf_meshopt_compression_filter_quaternion) ||
            ((*pcVar13 == cgltf_meshopt_compression_filter_octahedral && (cVar19 != 4)))) &&
           (cVar19 != 8)) {
          return cgltf_result_invalid_gltf;
        }
      }
      pcVar13 = pcVar13 + 0x24;
      cVar21 = cVar21 - 1;
    } while (cVar21 != 0);
  }
  cVar21 = data->meshes_count;
  if (cVar21 != 0) {
    pcVar5 = data->meshes;
    cVar10 = 0;
    do {
      if (((pcVar5[cVar10].weights != (cgltf_float *)0x0) && (pcVar5[cVar10].primitives_count != 0))
         && ((pcVar5[cVar10].primitives)->targets_count != pcVar5[cVar10].weights_count)) {
        return cgltf_result_invalid_gltf;
      }
      cVar19 = pcVar5[cVar10].primitives_count;
      if (pcVar5[cVar10].target_names == (char **)0x0) {
        if (cVar19 != 0) goto LAB_00104f03;
      }
      else if (cVar19 != 0) {
        if ((pcVar5[cVar10].primitives)->targets_count != pcVar5[cVar10].target_names_count) {
          return cgltf_result_invalid_gltf;
        }
LAB_00104f03:
        pcVar6 = pcVar5[cVar10].primitives;
        cVar22 = 0;
        do {
          cVar11 = pcVar6[cVar22].attributes_count;
          if (cVar11 != 0) {
            pcVar7 = (pcVar6[cVar22].attributes)->data;
            if (pcVar7 != (cgltf_accessor *)0x0) {
              ppcVar14 = &(pcVar6[cVar22].attributes)->data;
              do {
                if ((*ppcVar14 != (cgltf_accessor *)0x0) && ((*ppcVar14)->count != pcVar7->count)) {
                  return cgltf_result_invalid_gltf;
                }
                ppcVar14 = ppcVar14 + 4;
                cVar11 = cVar11 - 1;
              } while (cVar11 != 0);
              if (pcVar6[cVar22].targets_count != 0) {
                cVar11 = 0;
                do {
                  cVar17 = pcVar6[cVar22].targets[cVar11].attributes_count;
                  if (cVar17 != 0) {
                    ppcVar14 = &(pcVar6[cVar22].targets[cVar11].attributes)->data;
                    do {
                      if ((*ppcVar14 != (cgltf_accessor *)0x0) &&
                         ((*ppcVar14)->count != pcVar7->count)) {
                        return cgltf_result_invalid_gltf;
                      }
                      ppcVar14 = ppcVar14 + 4;
                      cVar17 = cVar17 - 1;
                    } while (cVar17 != 0);
                  }
                  cVar11 = cVar11 + 1;
                } while (cVar11 != pcVar6[cVar22].targets_count);
              }
              pcVar8 = pcVar6[cVar22].indices;
              if (pcVar8 != (cgltf_accessor *)0x0) {
                cVar1 = pcVar8->component_type;
                if (cgltf_component_type_r_32u < cVar1) {
                  return cgltf_result_invalid_gltf;
                }
                if ((0x34U >> (cVar1 & 0x1f) & 1) == 0) {
                  return cgltf_result_invalid_gltf;
                }
                pcVar3 = pcVar8->buffer_view;
                if (((pcVar3 != (cgltf_buffer_view *)0x0) &&
                    (pcVar4 = (cgltf_buffer_view *)pcVar3->buffer->data,
                    pcVar4 != (cgltf_buffer_view *)0x0)) &&
                   (cVar11 = cgltf_calc_index_bound
                                       (pcVar4,pcVar3->offset,(cgltf_component_type)pcVar8->offset,
                                        (ulong)cVar1), pcVar7->count <= cVar11)) {
                  return cgltf_result_data_too_short;
                }
              }
            }
          }
          cVar22 = cVar22 + 1;
        } while (cVar22 != cVar19);
      }
      cVar10 = cVar10 + 1;
    } while (cVar10 != cVar21);
  }
  cVar21 = data->nodes_count;
  if (cVar21 != 0) {
    pcVar12 = &data->nodes->weights_count;
    cVar10 = cVar21;
    do {
      if ((((cgltf_float *)pcVar12[-1] != (cgltf_float *)0x0) &&
          (pcVar5 = (cgltf_mesh *)pcVar12[-4], pcVar5 != (cgltf_mesh *)0x0)) &&
         ((pcVar5->primitives_count != 0 && (pcVar5->primitives->targets_count != *pcVar12)))) {
        return cgltf_result_invalid_gltf;
      }
      pcVar12 = pcVar12 + 0x1e;
      cVar10 = cVar10 - 1;
    } while (cVar10 != 0);
    cVar10 = 0;
    do {
      pcVar15 = data->nodes[cVar10].parent;
      if (pcVar15 != (cgltf_node *)0x0) {
        for (pcVar18 = pcVar15->parent; pcVar18 != (cgltf_node *)0x0;
            pcVar18 = pcVar18->parent->parent) {
          if (pcVar15 == pcVar18) {
            return cgltf_result_invalid_gltf;
          }
          if ((pcVar18->parent == (cgltf_node *)0x0) ||
             (pcVar15 = pcVar15->parent, pcVar15 == (cgltf_node *)0x0)) break;
        }
      }
      cVar10 = cVar10 + 1;
    } while (cVar10 != cVar21);
  }
  if (data->scenes_count != 0) {
    cVar21 = 0;
    do {
      cVar10 = data->scenes[cVar21].nodes_count;
      if (cVar10 != 0) {
        cVar19 = 0;
        do {
          if (data->scenes[cVar21].nodes[cVar19]->parent != (cgltf_node *)0x0) {
            return cgltf_result_invalid_gltf;
          }
          cVar19 = cVar19 + 1;
        } while (cVar10 != cVar19);
      }
      cVar21 = cVar21 + 1;
    } while (cVar21 != data->scenes_count);
  }
  if (data->animations_count != 0) {
    cVar21 = 0;
    do {
      cVar10 = data->animations[cVar21].channels_count;
      if (cVar10 != 0) {
        pcVar20 = &(data->animations[cVar21].channels)->target_path;
        do {
          if (*(cgltf_node **)(pcVar20 + -2) != (cgltf_node *)0x0) {
            cVar19 = 1;
            if (*pcVar20 == cgltf_animation_path_type_weights) {
              pcVar5 = (*(cgltf_node **)(pcVar20 + -2))->mesh;
              if (pcVar5 == (cgltf_mesh *)0x0) {
                return cgltf_result_invalid_gltf;
              }
              if (pcVar5->primitives_count == 0) {
                return cgltf_result_invalid_gltf;
              }
              cVar19 = pcVar5->primitives->targets_count;
            }
            pcVar9 = ((cgltf_animation_channel *)(pcVar20 + -4))->sampler;
            if (cVar19 * pcVar9->input->count *
                ((ulong)(pcVar9->interpolation == cgltf_interpolation_type_cubic_spline) * 2 + 1) -
                pcVar9->output->count != 0) {
              return cgltf_result_data_too_short;
            }
          }
          pcVar20 = pcVar20 + 0xe;
          cVar10 = cVar10 - 1;
        } while (cVar10 != 0);
      }
      cVar21 = cVar21 + 1;
    } while (cVar21 != data->animations_count);
  }
  return cgltf_result_success;
}

Assistant:

cgltf_result cgltf_validate(cgltf_data* data)
{
	for (cgltf_size i = 0; i < data->accessors_count; ++i)
	{
		cgltf_accessor* accessor = &data->accessors[i];

		cgltf_size element_size = cgltf_calc_size(accessor->type, accessor->component_type);

		if (accessor->buffer_view)
		{
			cgltf_size req_size = accessor->offset + accessor->stride * (accessor->count - 1) + element_size;

			if (accessor->buffer_view->size < req_size)
			{
				return cgltf_result_data_too_short;
			}
		}

		if (accessor->is_sparse)
		{
			cgltf_accessor_sparse* sparse = &accessor->sparse;

			cgltf_size indices_component_size = cgltf_calc_size(cgltf_type_scalar, sparse->indices_component_type);
			cgltf_size indices_req_size = sparse->indices_byte_offset + indices_component_size * sparse->count;
			cgltf_size values_req_size = sparse->values_byte_offset + element_size * sparse->count;

			if (sparse->indices_buffer_view->size < indices_req_size ||
				sparse->values_buffer_view->size < values_req_size)
			{
				return cgltf_result_data_too_short;
			}

			if (sparse->indices_component_type != cgltf_component_type_r_8u &&
				sparse->indices_component_type != cgltf_component_type_r_16u &&
				sparse->indices_component_type != cgltf_component_type_r_32u)
			{
				return cgltf_result_invalid_gltf;
			}

			if (sparse->indices_buffer_view->buffer->data)
			{
				cgltf_size index_bound = cgltf_calc_index_bound(sparse->indices_buffer_view, sparse->indices_byte_offset, sparse->indices_component_type, sparse->count);

				if (index_bound >= accessor->count)
				{
					return cgltf_result_data_too_short;
				}
			}
		}
	}

	for (cgltf_size i = 0; i < data->buffer_views_count; ++i)
	{
		cgltf_size req_size = data->buffer_views[i].offset + data->buffer_views[i].size;

		if (data->buffer_views[i].buffer && data->buffer_views[i].buffer->size < req_size)
		{
			return cgltf_result_data_too_short;
		}

		if (data->buffer_views[i].has_meshopt_compression)
		{
			cgltf_meshopt_compression* mc = &data->buffer_views[i].meshopt_compression;

			if (mc->buffer == NULL || mc->buffer->size < mc->offset + mc->size)
			{
				return cgltf_result_data_too_short;
			}

			if (data->buffer_views[i].stride && mc->stride != data->buffer_views[i].stride)
			{
				return cgltf_result_invalid_gltf;
			}

			if (data->buffer_views[i].size != mc->stride * mc->count)
			{
				return cgltf_result_invalid_gltf;
			}

			if (mc->mode == cgltf_meshopt_compression_mode_invalid)
			{
				return cgltf_result_invalid_gltf;
			}

			if (mc->mode == cgltf_meshopt_compression_mode_attributes && !(mc->stride % 4 == 0 && mc->stride <= 256))
			{
				return cgltf_result_invalid_gltf;
			}

			if (mc->mode == cgltf_meshopt_compression_mode_triangles && mc->count % 3 != 0)
			{
				return cgltf_result_invalid_gltf;
			}

			if ((mc->mode == cgltf_meshopt_compression_mode_triangles || mc->mode == cgltf_meshopt_compression_mode_indices) && mc->stride != 2 && mc->stride != 4)
			{
				return cgltf_result_invalid_gltf;
			}

			if ((mc->mode == cgltf_meshopt_compression_mode_triangles || mc->mode == cgltf_meshopt_compression_mode_indices) && mc->filter != cgltf_meshopt_compression_filter_none)
			{
				return cgltf_result_invalid_gltf;
			}

			if (mc->filter == cgltf_meshopt_compression_filter_octahedral && mc->stride != 4 && mc->stride != 8)
			{
				return cgltf_result_invalid_gltf;
			}

			if (mc->filter == cgltf_meshopt_compression_filter_quaternion && mc->stride != 8)
			{
				return cgltf_result_invalid_gltf;
			}
		}
	}

	for (cgltf_size i = 0; i < data->meshes_count; ++i)
	{
		if (data->meshes[i].weights)
		{
			if (data->meshes[i].primitives_count && data->meshes[i].primitives[0].targets_count != data->meshes[i].weights_count)
			{
				return cgltf_result_invalid_gltf;
			}
		}

		if (data->meshes[i].target_names)
		{
			if (data->meshes[i].primitives_count && data->meshes[i].primitives[0].targets_count != data->meshes[i].target_names_count)
			{
				return cgltf_result_invalid_gltf;
			}
		}

		for (cgltf_size j = 0; j < data->meshes[i].primitives_count; ++j)
		{
			//
			// Skip target count check because some VRM files omit targets for root primitive
			// which is not valid for glTF but has been accepted for VRM 
			//
			//if (data->meshes[i].primitives[j].targets_count != data->meshes[i].primitives[0].targets_count)
			//{
			//	return cgltf_result_invalid_gltf;
			//}

			if (data->meshes[i].primitives[j].attributes_count)
			{
				cgltf_accessor* first = data->meshes[i].primitives[j].attributes[0].data;
				if (first == NULL) continue;

				for (cgltf_size k = 0; k < data->meshes[i].primitives[j].attributes_count; ++k)
				{
					cgltf_accessor* accessor = data->meshes[i].primitives[j].attributes[k].data;
					if (accessor && accessor->count != first->count)
					{
						return cgltf_result_invalid_gltf;
					}
				}

				for (cgltf_size k = 0; k < data->meshes[i].primitives[j].targets_count; ++k)
				{
					for (cgltf_size m = 0; m < data->meshes[i].primitives[j].targets[k].attributes_count; ++m)
					{
						cgltf_accessor* accessor = data->meshes[i].primitives[j].targets[k].attributes[m].data;
						if (accessor && accessor->count != first->count)
						{
							return cgltf_result_invalid_gltf;
						}
					}
				}

				cgltf_accessor* indices = data->meshes[i].primitives[j].indices;

				if (indices &&
					indices->component_type != cgltf_component_type_r_8u &&
					indices->component_type != cgltf_component_type_r_16u &&
					indices->component_type != cgltf_component_type_r_32u)
				{
					return cgltf_result_invalid_gltf;
				}

				if (indices && indices->buffer_view && indices->buffer_view->buffer->data)
				{
					cgltf_size index_bound = cgltf_calc_index_bound(indices->buffer_view, indices->offset, indices->component_type, indices->count);

					if (index_bound >= first->count)
					{
						return cgltf_result_data_too_short;
					}
				}
			}
		}
	}

	for (cgltf_size i = 0; i < data->nodes_count; ++i)
	{
		if (data->nodes[i].weights && data->nodes[i].mesh)
		{
			if (data->nodes[i].mesh->primitives_count && data->nodes[i].mesh->primitives[0].targets_count != data->nodes[i].weights_count)
			{
				return cgltf_result_invalid_gltf;
			}
		}
	}

	for (cgltf_size i = 0; i < data->nodes_count; ++i)
	{
		cgltf_node* p1 = data->nodes[i].parent;
		cgltf_node* p2 = p1 ? p1->parent : NULL;

		while (p1 && p2)
		{
			if (p1 == p2)
			{
				return cgltf_result_invalid_gltf;
			}

			p1 = p1->parent;
			p2 = p2->parent ? p2->parent->parent : NULL;
		}
	}

	for (cgltf_size i = 0; i < data->scenes_count; ++i)
	{
		for (cgltf_size j = 0; j < data->scenes[i].nodes_count; ++j)
		{
			if (data->scenes[i].nodes[j]->parent)
			{
				return cgltf_result_invalid_gltf;
			}
		}
	}

	for (cgltf_size i = 0; i < data->animations_count; ++i)
	{
		for (cgltf_size j = 0; j < data->animations[i].channels_count; ++j)
		{
			cgltf_animation_channel* channel = &data->animations[i].channels[j];

			if (!channel->target_node)
			{
				continue;
			}

			cgltf_size components = 1;

			if (channel->target_path == cgltf_animation_path_type_weights)
			{
				if (!channel->target_node->mesh || !channel->target_node->mesh->primitives_count)
				{
					return cgltf_result_invalid_gltf;
				}

				components = channel->target_node->mesh->primitives[0].targets_count;
			}

			cgltf_size values = channel->sampler->interpolation == cgltf_interpolation_type_cubic_spline ? 3 : 1;

			if (channel->sampler->input->count * components * values != channel->sampler->output->count)
			{
				return cgltf_result_data_too_short;
			}
		}
	}

	return cgltf_result_success;
}